

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

void __thiscall
duckdb::Value::SerializeInternal(Value *this,Serializer *serializer,bool serialize_type)

{
  PhysicalType PVar1;
  bool bVar2;
  uint uVar3;
  string *psVar4;
  vector<duckdb::Value,_true> *children;
  NotImplementedException *this_00;
  InternalException *this_01;
  uint *puVar5;
  undefined7 in_register_00000011;
  pointer __src;
  string_t blob;
  string blob_str;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 local_44;
  string local_40;
  
  if (((int)CONCAT71(in_register_00000011,serialize_type) != 0) ||
     (bVar2 = SerializationCompatibility::Compare
                        (&(serializer->options).serialization_compatibility,4), !bVar2)) {
    Serializer::WriteProperty<duckdb::LogicalType>(serializer,100,"type",&this->type_);
  }
  (*serializer->_vptr_Serializer[2])(serializer,0x65,"is_null");
  (*serializer->_vptr_Serializer[0xe])(serializer,(ulong)this->is_null);
  (*serializer->_vptr_Serializer[3])(serializer);
  if (this->is_null != false) {
    return;
  }
  PVar1 = (this->type_).physical_type_;
  switch(PVar1) {
  case BOOL:
    (*serializer->_vptr_Serializer[2])(serializer,0x66,"value");
    (*serializer->_vptr_Serializer[0xe])(serializer,(ulong)(this->value_).utinyint);
    break;
  case UINT8:
    (*serializer->_vptr_Serializer[2])(serializer,0x66,"value");
    (*serializer->_vptr_Serializer[0xf])(serializer,(ulong)(this->value_).utinyint);
    break;
  case INT8:
    (*serializer->_vptr_Serializer[2])(serializer,0x66,"value");
    (*serializer->_vptr_Serializer[0x10])(serializer,(ulong)(uint)(int)(this->value_).tinyint);
    break;
  case UINT16:
    (*serializer->_vptr_Serializer[2])(serializer,0x66,"value");
    (*serializer->_vptr_Serializer[0x11])(serializer,(ulong)(this->value_).usmallint);
    break;
  case INT16:
    (*serializer->_vptr_Serializer[2])(serializer,0x66,"value");
    (*serializer->_vptr_Serializer[0x12])(serializer,(ulong)(uint)(int)(this->value_).smallint);
    break;
  case UINT32:
    (*serializer->_vptr_Serializer[2])(serializer,0x66,"value");
    (*serializer->_vptr_Serializer[0x13])(serializer,(ulong)(this->value_).uinteger);
    break;
  case INT32:
    (*serializer->_vptr_Serializer[2])(serializer,0x66,"value");
    (*serializer->_vptr_Serializer[0x14])(serializer,(ulong)(this->value_).uinteger);
    break;
  case UINT64:
    (*serializer->_vptr_Serializer[2])(serializer,0x66,"value");
    (*serializer->_vptr_Serializer[0x15])(serializer,(this->value_).bigint);
    break;
  case INT64:
    (*serializer->_vptr_Serializer[2])(serializer,0x66,"value");
    (*serializer->_vptr_Serializer[0x16])(serializer,(this->value_).bigint);
    break;
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x16:
  case STRUCT|BOOL:
  case STRUCT|UINT8:
  case STRUCT|INT8:
  case STRUCT|UINT16:
switchD_002dee8c_caseD_a:
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Unimplemented type for Serialize","");
    NotImplementedException::NotImplementedException(this_00,&local_40);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    (*serializer->_vptr_Serializer[2])(serializer,0x66,"value");
    (*serializer->_vptr_Serializer[0x19])((ulong)(this->value_).uinteger,serializer);
    break;
  case DOUBLE:
    (*serializer->_vptr_Serializer[2])(serializer,0x66,"value");
    (*serializer->_vptr_Serializer[0x1a])((this->value_).bigint,serializer);
    break;
  case INTERVAL:
    Serializer::WriteProperty<duckdb::interval_t>(serializer,0x66,"value",&(this->value_).interval);
    return;
  case LIST:
    children = ListValue::GetChildren(this);
    goto LAB_002def9d;
  case STRUCT:
    children = StructValue::GetChildren(this);
    goto LAB_002def9d;
  case ARRAY:
    children = ArrayValue::GetChildren(this);
LAB_002def9d:
    SerializeChildren(serializer,children,&this->type_);
    return;
  default:
    puVar5 = &switchD_002deed2::switchdataD_0132aa58;
    switch(PVar1) {
    case VARCHAR:
      if ((this->type_).id_ == BLOB) {
        psVar4 = StringValue::Get_abi_cxx11_(this);
        __src = (psVar4->_M_dataplus)._M_p;
        uVar3 = (uint)psVar4->_M_string_length;
        if (uVar3 < 0xd) {
          local_44 = 0;
          uStack_4c = 0;
          uStack_48 = 0;
          if (uVar3 == 0) {
            __src = (pointer)0x0;
          }
          else {
            switchD_00b041bd::default(&uStack_4c,__src,(ulong)(uVar3 & 0xf));
            __src = (pointer)CONCAT44(local_44,uStack_48);
          }
        }
        else {
          uStack_4c = *(undefined4 *)__src;
        }
        blob.value.pointer.ptr = (char *)puVar5;
        blob.value._0_8_ = __src;
        Blob::ToString_abi_cxx11_(&local_40,(Blob *)CONCAT44(uStack_4c,uVar3),blob);
        (*serializer->_vptr_Serializer[2])(serializer,0x66,"value");
        (*serializer->_vptr_Serializer[0x1c])(serializer,&local_40);
        (*serializer->_vptr_Serializer[3])(serializer);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p == &local_40.field_2) {
          return;
        }
        operator_delete(local_40._M_dataplus._M_p);
        return;
      }
      psVar4 = StringValue::Get_abi_cxx11_(this);
      (*serializer->_vptr_Serializer[2])(serializer,0x66,"value");
      (*serializer->_vptr_Serializer[0x1c])(serializer,psVar4);
      break;
    default:
      goto switchD_002dee8c_caseD_a;
    case UINT128:
      (*serializer->_vptr_Serializer[2])(serializer,0x66,"value");
      (*serializer->_vptr_Serializer[0x18])
                (serializer,(this->value_).bigint,(this->value_).hugeint.upper);
      break;
    case INT128:
      (*serializer->_vptr_Serializer[2])(serializer,0x66,"value");
      (*serializer->_vptr_Serializer[0x17])
                (serializer,(this->value_).bigint,(this->value_).hugeint.upper);
      break;
    case BIT:
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"BIT type should not be serialized","");
      InternalException::InternalException(this_01,&local_40);
      __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  (*serializer->_vptr_Serializer[3])(serializer);
  return;
}

Assistant:

void Value::SerializeInternal(Serializer &serializer, bool serialize_type) const {
	if (serialize_type || !serializer.ShouldSerialize(4)) {
		// only the root value needs to serialize its type
		// for forwards compatibility reasons, we also serialize the type always when targeting versions < v1.2.0
		serializer.WriteProperty(100, "type", type_);
	}
	serializer.WriteProperty(101, "is_null", is_null);
	if (IsNull()) {
		return;
	}
	switch (type_.InternalType()) {
	case PhysicalType::BIT:
		throw InternalException("BIT type should not be serialized");
	case PhysicalType::BOOL:
		serializer.WriteProperty(102, "value", value_.boolean);
		break;
	case PhysicalType::INT8:
		serializer.WriteProperty(102, "value", value_.tinyint);
		break;
	case PhysicalType::INT16:
		serializer.WriteProperty(102, "value", value_.smallint);
		break;
	case PhysicalType::INT32:
		serializer.WriteProperty(102, "value", value_.integer);
		break;
	case PhysicalType::INT64:
		serializer.WriteProperty(102, "value", value_.bigint);
		break;
	case PhysicalType::UINT8:
		serializer.WriteProperty(102, "value", value_.utinyint);
		break;
	case PhysicalType::UINT16:
		serializer.WriteProperty(102, "value", value_.usmallint);
		break;
	case PhysicalType::UINT32:
		serializer.WriteProperty(102, "value", value_.uinteger);
		break;
	case PhysicalType::UINT64:
		serializer.WriteProperty(102, "value", value_.ubigint);
		break;
	case PhysicalType::INT128:
		serializer.WriteProperty(102, "value", value_.hugeint);
		break;
	case PhysicalType::UINT128:
		serializer.WriteProperty(102, "value", value_.uhugeint);
		break;
	case PhysicalType::FLOAT:
		serializer.WriteProperty(102, "value", value_.float_);
		break;
	case PhysicalType::DOUBLE:
		serializer.WriteProperty(102, "value", value_.double_);
		break;
	case PhysicalType::INTERVAL:
		serializer.WriteProperty(102, "value", value_.interval);
		break;
	case PhysicalType::VARCHAR: {
		if (type_.id() == LogicalTypeId::BLOB) {
			auto blob_str = Blob::ToString(StringValue::Get(*this));
			serializer.WriteProperty(102, "value", blob_str);
		} else {
			serializer.WriteProperty(102, "value", StringValue::Get(*this));
		}
	} break;
	case PhysicalType::LIST:
		SerializeChildren(serializer, ListValue::GetChildren(*this), type_);
		break;
	case PhysicalType::STRUCT:
		SerializeChildren(serializer, StructValue::GetChildren(*this), type_);
		break;
	case PhysicalType::ARRAY:
		SerializeChildren(serializer, ArrayValue::GetChildren(*this), type_);
		break;
	default:
		throw NotImplementedException("Unimplemented type for Serialize");
	}
}